

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

void ARKodePrintMem(void *arkode_mem,FILE *outfile)

{
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x511,"ARKodePrintMem",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"arkode_mem = NULL illegal.");
    return;
  }
  if (outfile == (FILE *)0x0) {
    outfile = (FILE *)_stdout;
  }
  fprintf((FILE *)outfile,"itol = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x18));
  fprintf((FILE *)outfile,"ritol = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x1c));
  fprintf((FILE *)outfile,"mxhnil = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x318));
  fprintf((FILE *)outfile,"mxstep = %li\n",*(undefined8 *)((long)arkode_mem + 0x310));
  fprintf((FILE *)outfile,"lrw1 = %li\n",*(undefined8 *)((long)arkode_mem + 0x358));
  fprintf((FILE *)outfile,"liw1 = %li\n",*(undefined8 *)((long)arkode_mem + 0x360));
  fprintf((FILE *)outfile,"lrw = %li\n",*(undefined8 *)((long)arkode_mem + 0x368));
  fprintf((FILE *)outfile,"liw = %li\n",*(undefined8 *)((long)arkode_mem + 0x370));
  fprintf((FILE *)outfile,"user_efun = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x54));
  fprintf((FILE *)outfile,"tstopset = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x2a8));
  fprintf((FILE *)outfile,"tstopinterp = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x2ac));
  fprintf((FILE *)outfile,"tstop = %.15g\n",*(undefined8 *)((long)arkode_mem + 0x2b0));
  fprintf((FILE *)outfile,"VabstolMallocDone = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x3b8));
  fprintf((FILE *)outfile,"MallocDone = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x3c0));
  fprintf((FILE *)outfile,"initsetup = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x3c4));
  fprintf((FILE *)outfile,"init_type = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x3c8));
  fprintf((FILE *)outfile,"firststage = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x3cc));
  fprintf((FILE *)outfile,"uround = %.15g\n",*(undefined8 *)((long)arkode_mem + 8));
  fprintf((FILE *)outfile,"reltol = %.15g\n",*(undefined8 *)((long)arkode_mem + 0x20));
  fprintf((FILE *)outfile,"Sabstol = %.15g\n",*(undefined8 *)((long)arkode_mem + 0x28));
  fprintf((FILE *)outfile,"fixedstep = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x300));
  fprintf((FILE *)outfile,"tolsf = %.15g\n",*(undefined8 *)((long)arkode_mem + 0x398));
  fprintf((FILE *)outfile,"call_fullrhs = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x3d4));
  fprintf((FILE *)outfile,"do_adjoint = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x410));
  fprintf((FILE *)outfile,"nhnil = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x338));
  fprintf((FILE *)outfile,"nst_attempts = %li\n",*(undefined8 *)((long)arkode_mem + 0x328));
  fprintf((FILE *)outfile,"nst = %li\n",*(undefined8 *)((long)arkode_mem + 0x330));
  fprintf((FILE *)outfile,"ncfn = %li\n",*(undefined8 *)((long)arkode_mem + 0x340));
  fprintf((FILE *)outfile,"netf = %li\n",*(undefined8 *)((long)arkode_mem + 0x348));
  fprintf((FILE *)outfile,"hin = %.15g\n",*(undefined8 *)((long)arkode_mem + 0x2b8));
  fprintf((FILE *)outfile,"h = %.15g\n",*(undefined8 *)((long)arkode_mem + 0x2c0));
  fprintf((FILE *)outfile,"hprime = %.15g\n",*(undefined8 *)((long)arkode_mem + 0x2d8));
  fprintf((FILE *)outfile,"next_h = %.15g\n",*(undefined8 *)((long)arkode_mem + 0x2e0));
  fprintf((FILE *)outfile,"eta = %.15g\n",*(undefined8 *)((long)arkode_mem + 0x2e8));
  fprintf((FILE *)outfile,"tcur = %.15g\n",*(undefined8 *)((long)arkode_mem + 0x2f0));
  fprintf((FILE *)outfile,"tretlast = %.15g\n",*(undefined8 *)((long)arkode_mem + 0x2f8));
  fprintf((FILE *)outfile,"hmin = %.15g\n",*(undefined8 *)((long)arkode_mem + 0x2c8));
  fprintf((FILE *)outfile,"hmax_inv = %.15g\n",*(undefined8 *)((long)arkode_mem + 0x2d0));
  fprintf((FILE *)outfile,"h0u = %.15g\n",*(undefined8 *)((long)arkode_mem + 0x378));
  fprintf((FILE *)outfile,"tn = %.15g\n",*(undefined8 *)((long)arkode_mem + 0x380));
  fprintf((FILE *)outfile,"hold = %.15g\n",*(undefined8 *)((long)arkode_mem + 0x390));
  fprintf((FILE *)outfile,"maxnef = %i\n",(ulong)*(uint *)((long)arkode_mem + 800));
  fprintf((FILE *)outfile,"maxncf = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x324));
  fwrite("timestep adaptivity structure:\n",0x1f,1,(FILE *)outfile);
  arkPrintAdaptMem(*(ARKodeHAdaptMem *)((long)arkode_mem + 0x308),outfile);
  fprintf((FILE *)outfile,"constraintsSet = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x80));
  fprintf((FILE *)outfile,"maxconstrfails = %i\n",(ulong)*(uint *)((long)arkode_mem + 0x31c));
  if (*(long *)((long)arkode_mem + 0x3d8) != 0) {
    arkPrintRootMem(arkode_mem,outfile);
  }
  if (*(ARKInterp *)((long)arkode_mem + 0x298) == (ARKInterp)0x0) {
    fwrite("interpolation = NULL\n",0x15,1,(FILE *)outfile);
  }
  else {
    arkInterpPrintMem(*(ARKInterp *)((long)arkode_mem + 0x298),outfile);
  }
  if (*(code **)((long)arkode_mem + 0xd8) != (code *)0x0) {
    (**(code **)((long)arkode_mem + 0xd8))(arkode_mem,outfile);
    return;
  }
  return;
}

Assistant:

void ARKodePrintMem(void* arkode_mem, FILE* outfile)
{
  ARKodeMem ark_mem;

  /* Check if ark_mem exists */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return;
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* if outfile==NULL, set it to stdout */
  if (outfile == NULL) { outfile = stdout; }

  /* output general values */
  fprintf(outfile, "itol = %i\n", ark_mem->itol);
  fprintf(outfile, "ritol = %i\n", ark_mem->ritol);
  fprintf(outfile, "mxhnil = %i\n", ark_mem->mxhnil);
  fprintf(outfile, "mxstep = %li\n", ark_mem->mxstep);
  fprintf(outfile, "lrw1 = %li\n", (long int)ark_mem->lrw1);
  fprintf(outfile, "liw1 = %li\n", (long int)ark_mem->liw1);
  fprintf(outfile, "lrw = %li\n", (long int)ark_mem->lrw);
  fprintf(outfile, "liw = %li\n", (long int)ark_mem->liw);
  fprintf(outfile, "user_efun = %i\n", ark_mem->user_efun);
  fprintf(outfile, "tstopset = %i\n", ark_mem->tstopset);
  fprintf(outfile, "tstopinterp = %i\n", ark_mem->tstopinterp);
  fprintf(outfile, "tstop = " SUN_FORMAT_G "\n", ark_mem->tstop);
  fprintf(outfile, "VabstolMallocDone = %i\n", ark_mem->VabstolMallocDone);
  fprintf(outfile, "MallocDone = %i\n", ark_mem->MallocDone);
  fprintf(outfile, "initsetup = %i\n", ark_mem->initsetup);
  fprintf(outfile, "init_type = %i\n", ark_mem->init_type);
  fprintf(outfile, "firststage = %i\n", ark_mem->firststage);
  fprintf(outfile, "uround = " SUN_FORMAT_G "\n", ark_mem->uround);
  fprintf(outfile, "reltol = " SUN_FORMAT_G "\n", ark_mem->reltol);
  fprintf(outfile, "Sabstol = " SUN_FORMAT_G "\n", ark_mem->Sabstol);
  fprintf(outfile, "fixedstep = %i\n", ark_mem->fixedstep);
  fprintf(outfile, "tolsf = " SUN_FORMAT_G "\n", ark_mem->tolsf);
  fprintf(outfile, "call_fullrhs = %i\n", ark_mem->call_fullrhs);
  fprintf(outfile, "do_adjoint = %i\n", ark_mem->do_adjoint);

  /* output counters */
  fprintf(outfile, "nhnil = %i\n", ark_mem->nhnil);
  fprintf(outfile, "nst_attempts = %li\n", ark_mem->nst_attempts);
  fprintf(outfile, "nst = %li\n", ark_mem->nst);
  fprintf(outfile, "ncfn = %li\n", ark_mem->ncfn);
  fprintf(outfile, "netf = %li\n", ark_mem->netf);

  /* output time-stepping values */
  fprintf(outfile, "hin = " SUN_FORMAT_G "\n", ark_mem->hin);
  fprintf(outfile, "h = " SUN_FORMAT_G "\n", ark_mem->h);
  fprintf(outfile, "hprime = " SUN_FORMAT_G "\n", ark_mem->hprime);
  fprintf(outfile, "next_h = " SUN_FORMAT_G "\n", ark_mem->next_h);
  fprintf(outfile, "eta = " SUN_FORMAT_G "\n", ark_mem->eta);
  fprintf(outfile, "tcur = " SUN_FORMAT_G "\n", ark_mem->tcur);
  fprintf(outfile, "tretlast = " SUN_FORMAT_G "\n", ark_mem->tretlast);
  fprintf(outfile, "hmin = " SUN_FORMAT_G "\n", ark_mem->hmin);
  fprintf(outfile, "hmax_inv = " SUN_FORMAT_G "\n", ark_mem->hmax_inv);
  fprintf(outfile, "h0u = " SUN_FORMAT_G "\n", ark_mem->h0u);
  fprintf(outfile, "tn = " SUN_FORMAT_G "\n", ark_mem->tn);
  fprintf(outfile, "hold = " SUN_FORMAT_G "\n", ark_mem->hold);
  fprintf(outfile, "maxnef = %i\n", ark_mem->maxnef);
  fprintf(outfile, "maxncf = %i\n", ark_mem->maxncf);

  /* output time-stepping adaptivity structure */
  fprintf(outfile, "timestep adaptivity structure:\n");
  arkPrintAdaptMem(ark_mem->hadapt_mem, outfile);

  /* output inequality constraints quantities */
  fprintf(outfile, "constraintsSet = %i\n", ark_mem->constraintsSet);
  fprintf(outfile, "maxconstrfails = %i\n", ark_mem->maxconstrfails);

  /* output root-finding quantities */
  if (ark_mem->root_mem != NULL)
  {
    (void)arkPrintRootMem((void*)ark_mem, outfile);
  }

  /* output interpolation quantities */
  if (ark_mem->interp) { arkInterpPrintMem(ark_mem->interp, outfile); }
  else { fprintf(outfile, "interpolation = NULL\n"); }

#ifdef SUNDIALS_DEBUG_PRINTVEC
  /* output vector quantities */
  fprintf(outfile, "Vapbsol:\n");
  N_VPrintFile(ark_mem->Vabstol, outfile);
  fprintf(outfile, "ewt:\n");
  N_VPrintFile(ark_mem->ewt, outfile);
  if (!ark_mem->rwt_is_ewt)
  {
    fprintf(outfile, "rwt:\n");
    N_VPrintFile(ark_mem->rwt, outfile);
  }
  fprintf(outfile, "ycur:\n");
  N_VPrintFile(ark_mem->ycur, outfile);
  fprintf(outfile, "yn:\n");
  N_VPrintFile(ark_mem->yn, outfile);
  fprintf(outfile, "fn:\n");
  if (ark_mem->fn) { N_VPrintFile(ark_mem->fn, outfile); }
  fprintf(outfile, "tempv1:\n");
  N_VPrintFile(ark_mem->tempv1, outfile);
  fprintf(outfile, "tempv2:\n");
  N_VPrintFile(ark_mem->tempv2, outfile);
  fprintf(outfile, "tempv3:\n");
  N_VPrintFile(ark_mem->tempv3, outfile);
  fprintf(outfile, "tempv4:\n");
  N_VPrintFile(ark_mem->tempv4, outfile);
  fprintf(outfile, "tempv5:\n");
  N_VPrintFile(ark_mem->tempv5, outfile);
  fprintf(outfile, "constraints:\n");
  N_VPrintFile(ark_mem->constraints, outfile);
#endif

  /* Call stepper PrintMem function (if provided) */
  if (ark_mem->step_printmem) { ark_mem->step_printmem(ark_mem, outfile); }
}